

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O2

RootBlock * __thiscall SQASTReader::readAst(SQASTReader *this,SQChar **sourcename)

{
  bool bVar1;
  int iVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  undefined4 extraout_var;
  RootBlock *pRVar5;
  
  iVar2 = _setjmp((__jmp_buf_tag *)this->_errorjmp);
  if (iVar2 == 0) {
    (*this->stream->_vptr_InputStream[4])(this->stream,0);
    bVar1 = checkMagic(this);
    if (!bVar1) {
      error(this,"Not a AST bionary data");
    }
    (**this->stream->_vptr_InputStream)();
    iVar2 = (**this->stream->_vptr_InputStream)();
    this->op_delta = (int)(char)iVar2;
    (**this->stream->_vptr_InputStream)();
    (**this->stream->_vptr_InputStream)();
    uVar3 = InputStream::readVaruint(this->stream);
    uVar4 = InputStream::readRawUInt64(this->stream);
    iVar2 = (*this->stream->_vptr_InputStream[3])();
    (*this->stream->_vptr_InputStream[4])(this->stream,uVar4);
    readStringTable(this);
    (*this->stream->_vptr_InputStream[4])(this->stream,CONCAT44(extraout_var,iVar2));
    *sourcename = (this->stringVector)._vals[uVar3 & 0xffffffff];
    pRVar5 = readRoot(this);
  }
  else {
    pRVar5 = (RootBlock *)0x0;
  }
  return pRVar5;
}

Assistant:

RootBlock *SQASTReader::readAst(const SQChar *&sourcename) {
  if (setjmp(_errorjmp) == 0) {
    stream->seek(0);

    const char *m = MAGIC;

    if (!checkMagic()) {
      error("Not a AST bionary data");
    }

    uint8_t version = stream->readInt8();
    op_delta = stream->readInt8();
    uint8_t sq_int_size = stream->readInt8();
    uint8_t sq_float_size = stream->readInt8();

    uint32_t sourceNameIdx = stream->readUInt32();

    uintptr_t stringTableOffset = stream->readRawUInt64();
    size_t dataOffset = stream->pos();

    stream->seek(stringTableOffset);
    readStringTable();
    stream->seek(dataOffset);

    sourcename = getString(sourceNameIdx);

    RootBlock *root = readRoot();

    assert(stream->pos() == stringTableOffset);

    return root;
  }
  else {
    return nullptr;
  }
}